

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composition.cc
# Opt level: O2

bool tinyusdz::anon_unknown_160::CompositeInheritsRec
               (uint32_t depth,Layer *layer,PrimSpec *primspec,string *warn,string *err)

{
  optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>_>
  *this;
  pointer pPVar1;
  Path *path;
  bool bVar2;
  ostream *poVar3;
  value_type *pvVar4;
  long lVar5;
  PrimSpec *src;
  string *err_00;
  PrimSpec *child;
  pointer primspec_00;
  PrimSpec *inheritPrimSpec;
  ostringstream ss_e;
  PrimSpec *local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [11];
  
  if (depth < 0x100001) {
    primspec_00 = (primspec->_children).
                  super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    pPVar1 = (primspec->_children).
             super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>._M_impl.
             super__Vector_impl_data._M_finish;
    err_00 = err;
    do {
      if (primspec_00 == pPVar1) {
        if ((primspec->_metas).inherits.has_value_ != true) {
          return true;
        }
        this = &(primspec->_metas).inherits;
        nonstd::optional_lite::
        optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>_>
        ::value(this);
        pvVar4 = nonstd::optional_lite::
                 optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>_>
                 ::value(this);
        path = (pvVar4->second).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
               _M_impl.super__Vector_impl_data._M_start;
        lVar5 = ((long)(pvVar4->second).
                       super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)path) / 0xd0;
        if (lVar5 == 1) {
          local_1d0 = (PrimSpec *)0x0;
          bVar2 = Layer::find_primspec_at(layer,path,&local_1d0,err);
          if (!bVar2) {
            if (err == (string *)0x0) {
              return false;
            }
            ::std::operator+(&local_1c8,"Inheirt primspec failed since Path <",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             path);
            ::std::operator+(local_1a8,&local_1c8,"> not found or is invalid.\n");
            ::std::__cxx11::string::append((string *)err);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            return false;
          }
          if (local_1d0 != (PrimSpec *)0x0) {
            bVar2 = InheritPrimSpec((tinyusdz *)primspec,local_1d0,src,err,err_00);
            if (!bVar2) {
              return false;
            }
            goto LAB_00173627;
          }
          local_1d0 = (PrimSpec *)0x0;
        }
        else if (lVar5 == 0) {
LAB_00173627:
          nonstd::optional_lite::
          optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>_>
          ::reset(this);
          return true;
        }
        if (err == (string *)0x0) {
          return false;
        }
        ::std::__cxx11::string::append((char *)err);
        return false;
      }
      err_00 = err;
      bVar2 = CompositeInheritsRec(depth + 1,layer,primspec_00,warn,err);
      primspec_00 = primspec_00 + 1;
    } while (bVar2);
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    poVar3 = ::std::operator<<((ostream *)local_1a8,"[error]");
    poVar3 = ::std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                              );
    poVar3 = ::std::operator<<(poVar3,":");
    poVar3 = ::std::operator<<(poVar3,"CompositeInheritsRec");
    poVar3 = ::std::operator<<(poVar3,"():");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x3bc);
    ::std::operator<<(poVar3," ");
    poVar3 = ::std::operator<<((ostream *)local_1a8,"Too deep.");
    ::std::operator<<(poVar3,"\n");
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::append((string *)err);
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  }
  return false;
}

Assistant:

bool CompositeInheritsRec(uint32_t depth, const Layer &layer,
                          PrimSpec &primspec /* [inout] */, std::string *warn,
                          std::string *err) {
  if (depth > (1024 * 1024)) {
    PUSH_ERROR_AND_RETURN("Too deep.");
  }

  // Traverse children first.
  for (auto &child : primspec.children()) {
    if (!CompositeInheritsRec(depth + 1, layer, child, warn, err)) {
      return false;
    }
  }

  if (primspec.metas().inherits) {
    const auto &qual = primspec.metas().inherits.value().first;
    const auto &inherits = primspec.metas().inherits.value().second;

    if (inherits.size() == 0) {
      // no-op, just remove `inherits` metadataum.
      primspec.metas().inherits.reset();
      return true;
    }

    if (inherits.size() != 1) {
      if (err) {
        (*err) += "Multiple inheritance is not supporetd.\n";
      }
      return false;
    }

    const Path &inheritPath = inherits[0];

    const PrimSpec *inheritPrimSpec{nullptr};

    if (!layer.find_primspec_at(inheritPath, &inheritPrimSpec, err)) {
      if (err) {
        (*err) += "Inheirt primspec failed since Path <" +
                  inheritPath.prim_part() + "> not found or is invalid.\n";
      }

      return false;
    }

    // TODO: listEdit
    DCOUT("TODO: listEdit in `inherits`");
    (void)qual;

    if (inheritPrimSpec) {
      if (!InheritPrimSpec(primspec, *inheritPrimSpec, warn, err)) {
        return false;
      }

      // remove `inherits` metadataum.
      primspec.metas().inherits.reset();

    } else {
      // ???
      if (err) {
        (*err) +=
            "Inernal error. PrimSpec is nullptr in CompositeInehritsRec.\n";
      }
      return false;
    }
  }

  return true;
}